

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitRefFunc(I64ToI32Lowering *this,RefFunc *curr)

{
  bool bVar1;
  bool bVar2;
  Type *pTVar3;
  Type TVar4;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar5;
  Signature local_128;
  HeapType local_118 [2];
  Type local_108;
  BasicType local_fc;
  Type local_f8;
  Type results;
  Type local_e8;
  Type local_e0;
  BasicType local_d4;
  Type local_d0;
  Type t_1;
  undefined1 local_b8 [8];
  Iterator __end3;
  Iterator __begin3;
  Type *__range3;
  vector<wasm::Type,_std::allocator<wasm::Type>_> newParams;
  Type params;
  Type local_68;
  Type t;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  HeapType HStack_30;
  bool hasI64Param;
  undefined1 local_28 [8];
  Signature sig;
  RefFunc *curr_local;
  I64ToI32Lowering *this_local;
  
  sig.results.id = (uintptr_t)curr;
  HStack_30 = wasm::Type::getHeapType
                        (&(curr->super_SpecificExpression<(wasm::Expression::Id)43>).
                          super_Expression.type);
  _local_28 = HeapType::getSignature(&stack0xffffffffffffffd0);
  bVar2 = false;
  join_0x00000010_0x00000000_ =
       (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
       wasm::Type::begin((Type *)local_28);
  _t = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
       wasm::Type::end((Type *)local_28);
  do {
    bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                      ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                       &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                        index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&t);
    if (!bVar1) {
LAB_01d639c3:
      newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_28;
      if (bVar2) {
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3);
        join_0x00000010_0x00000000_ =
             (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
             wasm::Type::begin((Type *)local_28);
        PVar5 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
                wasm::Type::end((Type *)local_28);
        while( true ) {
          __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)PVar5.index;
          local_b8 = (undefined1  [8])PVar5.parent;
          bVar2 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                            ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                             &__end3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *
                                    )local_b8);
          if (!bVar2) break;
          pTVar3 = wasm::Type::Iterator::operator*
                             ((Iterator *)
                              &__end3.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index);
          local_d0.id = pTVar3->id;
          local_d4 = i64;
          bVar2 = wasm::Type::operator==(&local_d0,&local_d4);
          if (bVar2) {
            wasm::Type::Type(&local_e0,i32);
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3,&local_e0);
            wasm::Type::Type(&local_e8,i32);
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3,&local_e8);
          }
          else {
            std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                      ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3,&local_d0);
          }
          ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                    ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                     &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index);
          PVar5.index = (size_t)__end3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                parent;
          PVar5.parent = (Type *)local_b8;
        }
        wasm::Type::Type(&results,(Tuple *)&__range3);
        newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)results.id;
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3);
      }
      local_f8.id = sig.params.id;
      local_fc = i64;
      bVar2 = wasm::Type::operator==(&local_f8,&local_fc);
      if (bVar2) {
        wasm::Type::Type(&local_108,i32);
        local_f8.id = local_108.id;
      }
      bVar2 = wasm::Type::operator!=
                        ((Type *)&newParams.
                                  super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(Type *)local_28
                        );
      if ((bVar2) || (bVar2 = wasm::Type::operator!=(&local_f8,&sig.params), bVar2)) {
        pTVar3 = (Type *)(sig.results.id + 8);
        Signature::Signature
                  (&local_128,
                   (Type)newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,local_f8);
        HeapType::HeapType(local_118,local_128);
        TVar4 = wasm::Type::with(pTVar3,local_118[0]);
        *(uintptr_t *)(sig.results.id + 8) = TVar4.id;
      }
      return;
    }
    pTVar3 = wasm::Type::Iterator::operator*
                       ((Iterator *)
                        &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                         index);
    local_68.id = pTVar3->id;
    params.id._4_4_ = 3;
    bVar1 = wasm::Type::operator==(&local_68,(BasicType *)((long)&params.id + 4));
    if (bVar1) {
      bVar2 = true;
      goto LAB_01d639c3;
    }
    ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
               &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
  } while( true );
}

Assistant:

void visitRefFunc(RefFunc* curr) {
    auto sig = curr->type.getHeapType().getSignature();

    bool hasI64Param = false;
    for (auto t : sig.params) {
      if (t == Type::i64) {
        hasI64Param = true;
        break;
      }
    }
    auto params = sig.params;
    if (hasI64Param) {
      std::vector<Type> newParams;
      for (auto t : sig.params) {
        if (t == Type::i64) {
          newParams.push_back(Type::i32);
          newParams.push_back(Type::i32);
        } else {
          newParams.push_back(t);
        }
      }
      params = Type(newParams);
    };
    auto results = sig.results;
    // Update the results the same way we do when visiting functions. We use a
    // global rather than multivalue to lower i64 results.
    if (results == Type::i64) {
      results = Type::i32;
    }

    if (params != sig.params || results != sig.results) {
      curr->type = curr->type.with(HeapType(Signature(params, results)));
    }
  }